

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  int b;
  undefined8 *puVar2;
  stbi__uint32 b_00;
  stbi__context *s;
  byte bVar3;
  uint uVar4;
  int iVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  int iVar8;
  stbi_uc *psVar9;
  byte *pbVar10;
  void *pvVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  long lVar12;
  int a;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int *piVar17;
  ulong uVar18;
  int iVar19;
  
  s = z->s;
  uVar4 = stbi__get16be(s);
  if (uVar4 < 0xb) {
LAB_00128a26:
    stbi__g_failure_reason = "bad SOF len";
  }
  else {
    psVar9 = s->img_buffer;
    if (psVar9 < s->img_buffer_end) {
LAB_00128aa2:
      s->img_buffer = psVar9 + 1;
      if (*psVar9 == '\b') {
        sVar6 = stbi__get16be(s);
        s->img_y = sVar6;
        if (sVar6 == 0) {
          stbi__g_failure_reason = "no header height";
          return 0;
        }
        sVar6 = stbi__get16be(s);
        s->img_x = sVar6;
        if (sVar6 == 0) {
          stbi__g_failure_reason = "0 width";
          return 0;
        }
        pbVar10 = s->img_buffer;
        if (pbVar10 < s->img_buffer_end) {
LAB_00128b66:
          s->img_buffer = pbVar10 + 1;
          bVar3 = *pbVar10;
        }
        else {
          if (s->read_from_callbacks != 0) {
            psVar9 = s->buffer_start;
            iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
            if (iVar5 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar9;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar9;
              s->img_buffer_end = psVar9 + iVar5;
            }
            pbVar10 = s->img_buffer;
            goto LAB_00128b66;
          }
          bVar3 = 0;
        }
        if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
          stbi__g_failure_reason = "bad component count";
          return 0;
        }
        s->img_n = (uint)bVar3;
        if (bVar3 != 0) {
          lVar12 = 0;
          do {
            *(undefined8 *)((long)&z->img_comp[0].data + lVar12) = 0;
            *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar12) = 0;
            lVar12 = lVar12 + 0x60;
          } while ((ulong)bVar3 * 0x60 != lVar12);
        }
        if (uVar4 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
          z->rgb = 0;
          uVar18 = (ulong)(uint)s->img_n;
          if (0 < s->img_n) {
            psVar9 = s->buffer_start;
            psVar1 = s->buffer_start + 1;
            piVar17 = &z->img_comp[0].tq;
            lVar12 = 0;
            do {
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_00128c66:
                s->img_buffer = pbVar10 + 1;
                bVar3 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar9 + iVar5;
                  }
                  pbVar10 = s->img_buffer;
                  goto LAB_00128c66;
                }
                bVar3 = 0;
              }
              ((anon_struct_96_18_0d0905d3 *)(piVar17 + -3))->id = (uint)bVar3;
              if ((s->img_n == 3) && (bVar3 == "RGB"[lVar12])) {
                z->rgb = z->rgb + 1;
              }
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_00128d01:
                s->img_buffer = pbVar10 + 1;
                bVar3 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar9 + iVar5;
                  }
                  pbVar10 = s->img_buffer;
                  goto LAB_00128d01;
                }
                bVar3 = 0;
              }
              piVar17[-2] = (uint)(bVar3 >> 4);
              if ((byte)(bVar3 + 0xb0) < 0xc0) {
                stbi__g_failure_reason = "bad H";
                return 0;
              }
              piVar17[-1] = bVar3 & 0xf;
              if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
                stbi__g_failure_reason = "bad V";
                return 0;
              }
              pbVar10 = s->img_buffer;
              if (pbVar10 < s->img_buffer_end) {
LAB_00128da7:
                s->img_buffer = pbVar10 + 1;
                bVar3 = *pbVar10;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
                  if (iVar5 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar1;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar9;
                    s->img_buffer_end = psVar9 + iVar5;
                  }
                  pbVar10 = s->img_buffer;
                  goto LAB_00128da7;
                }
                bVar3 = 0;
              }
              *piVar17 = (uint)bVar3;
              if (3 < bVar3) {
                stbi__g_failure_reason = "bad TQ";
                return 0;
              }
              lVar12 = lVar12 + 1;
              uVar18 = (ulong)s->img_n;
              piVar17 = piVar17 + 0x18;
            } while (lVar12 < (long)uVar18);
          }
          if (scan != 0) {
            return 1;
          }
          sVar6 = s->img_x;
          b_00 = s->img_y;
          iVar8 = (int)uVar18;
          iVar5 = stbi__mad3sizes_valid(sVar6,b_00,iVar8,0);
          if (iVar5 == 0) {
            stbi__g_failure_reason = "too large";
            return 0;
          }
          uVar15 = 1;
          uVar13 = 1;
          if (0 < iVar8) {
            uVar13 = 1;
            lVar12 = 0;
            uVar15 = 1;
            do {
              uVar4 = *(uint *)((long)&z->img_comp[0].h + lVar12);
              uVar7 = *(uint *)((long)&z->img_comp[0].v + lVar12);
              if ((int)uVar15 < (int)uVar4) {
                uVar15 = (ulong)uVar4;
              }
              if ((int)uVar13 < (int)uVar7) {
                uVar13 = (ulong)uVar7;
              }
              lVar12 = lVar12 + 0x60;
            } while ((uVar18 & 0xffffffff) * 0x60 != lVar12);
          }
          iVar14 = (int)uVar15;
          z->img_h_max = iVar14;
          iVar5 = (int)uVar13;
          z->img_v_max = iVar5;
          z->img_mcu_w = iVar14 * 8;
          z->img_mcu_h = iVar5 * 8;
          uVar4 = ((sVar6 + iVar14 * 8) - 1) / (uint)(iVar14 * 8);
          z->img_mcu_x = uVar4;
          uVar7 = ((b_00 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
          z->img_mcu_y = uVar7;
          if (iVar8 < 1) {
            return 1;
          }
          iVar8 = 1;
          lVar12 = 0;
          while( true ) {
            iVar16 = *(int *)((long)&z->img_comp[0].h + lVar12);
            iVar19 = *(int *)((long)&z->img_comp[0].v + lVar12);
            *(int *)((long)&z->img_comp[0].x + lVar12) =
                 (int)((iVar16 * sVar6 + iVar14 + -1) / uVar15);
            *(int *)((long)&z->img_comp[0].y + lVar12) =
                 (int)((iVar19 * b_00 + iVar5 + -1) / uVar13);
            iVar16 = iVar16 * uVar4;
            a = iVar16 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar12) = a;
            iVar19 = iVar19 * uVar7;
            b = iVar19 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar12) = b;
            pvVar11 = stbi__malloc_mad2(a,b,0xf);
            puVar2 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar12);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar12) = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar12) = pvVar11;
            why = extraout_EDX;
            if (pvVar11 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar12) =
                 (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar12) = iVar16;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar12) = iVar19;
              pvVar11 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar12) = pvVar11;
              why = extraout_EDX_00;
              if (pvVar11 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar12) =
                   (long)pvVar11 + 0xfU & 0xfffffffffffffff0;
            }
            iVar8 = iVar8 + 1;
            lVar12 = lVar12 + 0x60;
            if ((uVar18 & 0xffffffff) * 0x60 == lVar12) {
              return 1;
            }
          }
          stbi__g_failure_reason = "outofmem";
          stbi__free_jpeg_components(z,iVar8,why);
          return 0;
        }
        goto LAB_00128a26;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar9 = s->buffer_start;
      iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
      if (iVar5 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar9;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar9;
        s->img_buffer_end = psVar9 + iVar5;
      }
      psVar9 = s->img_buffer;
      goto LAB_00128aa2;
    }
    stbi__g_failure_reason = "only 8-bit";
  }
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}